

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O3

Expression * wasm::TypeUpdating::fixLocalGet(LocalGet *get,Module *wasm)

{
  FeatureSet features;
  bool bVar1;
  Type TVar2;
  RefAs *this;
  
  bVar1 = wasm::Type::isNonNullable
                    (&(get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type
                    );
  this = (RefAs *)get;
  if ((bVar1) &&
     (features.features = (wasm->features).features, (features.features >> 0xc & 1) == 0)) {
    TVar2 = getValidLocalType((get->super_SpecificExpression<(wasm::Expression::Id)8>).
                              super_Expression.type.id,features);
    (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar2.id;
    this = (RefAs *)MixedArena::allocSpace(&wasm->allocator,0x20,8);
    (this->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression._id = RefAsId;
    (this->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id = 0;
    this->op = RefAsNonNull;
    this->value = (Expression *)get;
    RefAs::finalize(this);
  }
  return (Expression *)this;
}

Assistant:

Expression* fixLocalGet(LocalGet* get, Module& wasm) {
  if (get->type.isNonNullable() && !wasm.features.hasGCNNLocals()) {
    // The get should now return a nullable value, and a ref.as_non_null
    // fixes that up.
    get->type = getValidLocalType(get->type, wasm.features);
    return Builder(wasm).makeRefAs(RefAsNonNull, get);
  }
  return get;
}